

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLKinematicsIntermediateData.h
# Opt level: O2

void __thiscall
COLLADASaxFWL::KinematicsController::KinematicsController
          (KinematicsController *this,URI *uri,String *name)

{
  (this->super_IntermediateTargetableTemplate<5UL>).super_IntermediateTargetable.
  _vptr_IntermediateTargetable = (_func_int **)&PTR__KinematicsController_009facb8;
  COLLADABU::URI::URI(&this->mUri,uri,false);
  std::__cxx11::string::string((string *)&this->mName,(string *)name);
  (this->mAxisInfos).
  super__Vector_base<COLLADASaxFWL::AxisInfo,_std::allocator<COLLADASaxFWL::AxisInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mAxisInfos).
  super__Vector_base<COLLADASaxFWL::AxisInfo,_std::allocator<COLLADASaxFWL::AxisInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mAxisInfos).
  super__Vector_base<COLLADASaxFWL::AxisInfo,_std::allocator<COLLADASaxFWL::AxisInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mKinematicsInstanceKinematicsModels).
  super__List_base<COLLADASaxFWL::KinematicsInstanceKinematicsModel,_std::allocator<COLLADASaxFWL::KinematicsInstanceKinematicsModel>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       (_List_node_base *)&this->mKinematicsInstanceKinematicsModels;
  (this->mKinematicsInstanceKinematicsModels).
  super__List_base<COLLADASaxFWL::KinematicsInstanceKinematicsModel,_std::allocator<COLLADASaxFWL::KinematicsInstanceKinematicsModel>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)&this->mKinematicsInstanceKinematicsModels;
  (this->mKinematicsInstanceKinematicsModels).
  super__List_base<COLLADASaxFWL::KinematicsInstanceKinematicsModel,_std::allocator<COLLADASaxFWL::KinematicsInstanceKinematicsModel>_>
  ._M_impl._M_node._M_size = 0;
  return;
}

Assistant:

KinematicsController(const COLLADABU::URI& uri, const String& name )
			: mUri( uri ), mName(name) {}